

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Context *this_00;
  Printer *pPVar2;
  bool bVar3;
  Options *pOVar4;
  Descriptor *descriptor;
  string_view local_5c8;
  Options local_5b8;
  string_view local_568;
  Options local_558;
  string_view local_508;
  Options local_4f8;
  string_view local_4a8;
  Options local_498;
  string_view local_448;
  Options local_438;
  string_view local_3e8;
  Options local_3d8;
  string_view local_388;
  Options local_378;
  string_view local_328;
  string_view local_318;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_300;
  string_view local_2f8;
  string_view local_2e8;
  string_view local_2d8;
  Options local_2c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_270;
  string_view local_268;
  string_view local_258;
  string_view local_248;
  Options local_238;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  Options local_1a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_150;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  Options local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  string_view local_b8;
  string_view local_a8;
  string_view local_98 [2];
  Options local_78;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableEnumFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "private com.google.protobuf.Internal.IntList $name$_;\nprivate static final com.google.protobuf.Internal.IntListAdapter.IntConverter<\n    $type$> $name$_converter_ =\n        new com.google.protobuf.Internal.IntListAdapter.IntConverter<\n            $type$>() {\n          @java.lang.Override\n          public $type$ convert(int from) {\n            $type$ result = $type$.forNumber(from);\n            return result == null ? $unknown$ : result;\n          }\n        };\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  PrintExtraFieldInfo(&this->variables_,local_18);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_78,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_GETTER,&local_78,false,false,false);
  Options::~Options(&local_78);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,
             "@java.lang.Override\n$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return new com.google.protobuf.Internal.IntListAdapter<\n      $type$>($name$_, $name$_converter_);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_98[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_a8,local_b8,pFVar1,local_c0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_118,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_118,false,false,false);
  Options::~Options(&local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_150);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_138,local_148,pFVar1,local_150);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_1a8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_1a8,false,false,false);
  Options::~Options(&local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  $type$ result = $type$.forNumber($name$_.getInt(index));\n  return result == null ? $unknown$ : result;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1e0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1c8,local_1d8,pFVar1,local_1e0);
  bVar3 = SupportUnknownEnumValue(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_238,pOVar4);
    WriteFieldEnumValueAccessorDocComment(pPVar2,pFVar1,LIST_GETTER,&local_238,false,false);
    Options::~Options(&local_238);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_248,
               "@java.lang.Override\n$deprecation$public java.util.List<java.lang.Integer>\n${$get$capitalized_name$ValueList$}$() {\n  return $name$_;\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_248);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_270);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_258,local_268,pFVar1,local_270);
    pPVar2 = local_18;
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_2c8,pOVar4);
    WriteFieldEnumValueAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_2c8,false,false);
    Options::~Options(&local_2c8);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2d8,
               "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$(int index) {\n  return $name$_.getInt(index);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_2d8);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2f8,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_300);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_2e8,local_2f8,pFVar1,local_300);
  }
  bVar3 = anon_unknown_7::EnableExperimentalRuntimeForLite();
  if ((!bVar3) && (bVar3 = FieldDescriptor::is_packed(this->descriptor_), bVar3)) {
    this_00 = this->context_;
    descriptor = FieldDescriptor::containing_type(this->descriptor_);
    bVar3 = Context::HasGeneratedMethods(this_00,descriptor);
    pPVar2 = local_18;
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_318,"private int $name$MemoizedSerializedSize;\n");
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_318);
    }
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_328,
             "private void ensure$capitalized_name$IsMutable() {\n  com.google.protobuf.Internal.IntList tmp = $name$_;\n  if (!tmp.isModifiable()) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n  }\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_328);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_378,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_SETTER,&local_378,false,false,true);
  Options::~Options(&local_378);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_388,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void set$capitalized_name$(\n    int index, $type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value.getNumber());\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_388);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_3d8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_3d8,false,false,true);
  Options::~Options(&local_3d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3e8,
             "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void add$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value.getNumber());\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_3e8);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_438,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_MULTI_ADDER,&local_438,false,false,true);
  Options::~Options(&local_438);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_448,
             "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  for ($type$ value : values) {\n    $name$_.addInt(value.getNumber());\n  }\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_448);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_498,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_498,false,false,true);
  Options::~Options(&local_498);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4a8,"private void clear$capitalized_name$() {\n  $name$_ = emptyIntList();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_4a8);
  bVar3 = SupportUnknownEnumValue(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_4f8,pOVar4);
    WriteFieldEnumValueAccessorDocComment(pPVar2,pFVar1,SETTER,&local_4f8,false,false);
    Options::~Options(&local_4f8);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_508,
               "private void set$capitalized_name$Value(\n    int index, int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.setInt(index, value);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_508);
    pPVar2 = local_18;
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_558,pOVar4);
    WriteFieldEnumValueAccessorDocComment(pPVar2,pFVar1,LIST_ADDER,&local_558,false,false);
    Options::~Options(&local_558);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_568,
               "private void add$capitalized_name$Value(int value) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.addInt(value);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_568);
    pPVar2 = local_18;
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_5b8,pOVar4);
    WriteFieldEnumValueAccessorDocComment(pPVar2,pFVar1,LIST_MULTI_ADDER,&local_5b8,false,false);
    Options::~Options(&local_5b8);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5c8,
               "private void addAll$capitalized_name$Value(\n    java.lang.Iterable<java.lang.Integer> values) {\n  ensure$capitalized_name$IsMutable();\n  for (int value : values) {\n    $name$_.addInt(value);\n  }\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_5c8);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private com.google.protobuf.Internal.IntList $name$_;\n"
      "private static final "
      "com.google.protobuf.Internal.IntListAdapter.IntConverter<\n"
      "    $type$> $name$_converter_ =\n"
      "        new com.google.protobuf.Internal.IntListAdapter.IntConverter<\n"
      "            $type$>() {\n"
      "          @java.lang.Override\n"
      "          public $type$ convert(int from) {\n"
      "            $type$ result = $type$.forNumber(from);\n"
      "            return result == null ? $unknown$ : result;\n"
      "          }\n"
      "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return new com.google.protobuf.Internal.IntListAdapter<\n"
                 "      $type$>($name$_, $name$_converter_);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      // NB: Do not use the "$name$_converter_" field; the usage of generics
      // (and requisite upcasts to Object) prevent optimizations.  Even
      // without any optimizations, the below code is cheaper because it
      // avoids boxing an int and a checkcast from the generics.
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  $type$ result = $type$.forNumber($name$_.getInt(index));\n"
      "  return result == null ? $unknown$ : result;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (SupportUnknownEnumValue(descriptor_)) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER,
                                          context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return $name$_;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(
        printer, descriptor_, LIST_INDEXED_GETTER, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return $name$_.getInt(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  if (!EnableExperimentalRuntimeForLite() && descriptor_->is_packed() &&
      context_->HasGeneratedMethods(descriptor_->containing_type())) {
    printer->Print(variables_, "private int $name$MemoizedSerializedSize;\n");
  }

  // Generate private setters for the builder to proxy into.
  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      // Use a temporary to avoid a redundant iget-object.
      "  com.google.protobuf.Internal.IntList tmp = $name$_;\n"
      "  if (!tmp.isModifiable()) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n"
      "  }\n"
      "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void set$capitalized_name$(\n"
                 "    int index, $type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.setInt(index, value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void add$capitalized_name$($type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.addInt(value.getNumber());\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  for ($type$ value : values) {\n"
                 "    $name$_.addInt(value.getNumber());\n"
                 "  }\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ false, /* is_private */ true);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = emptyIntList();\n"
                 "}\n");

  if (SupportUnknownEnumValue(descriptor_)) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER,
                                          context_->options());
    printer->Print(variables_,
                   "private void set$capitalized_name$Value(\n"
                   "    int index, int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.setInt(index, value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          context_->options());
    printer->Print(variables_,
                   "private void add$capitalized_name$Value(int value) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  $name$_.addInt(value);\n"
                   "}\n");
    WriteFieldEnumValueAccessorDocComment(
        printer, descriptor_, LIST_MULTI_ADDER, context_->options());
    printer->Print(variables_,
                   "private void addAll$capitalized_name$Value(\n"
                   "    java.lang.Iterable<java.lang.Integer> values) {\n"
                   "  ensure$capitalized_name$IsMutable();\n"
                   "  for (int value : values) {\n"
                   "    $name$_.addInt(value);\n"
                   "  }\n"
                   "}\n");
  }
}